

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O3

longlong MercuryJson::parse_number(char *input,bool *is_decimal,size_t offset)

{
  char *pcVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  ulong uVar7;
  longlong lVar8;
  uint uVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM6_Qa;
  undefined1 auVar30 [16];
  undefined8 in_XMM10_Qb;
  string local_70;
  char *local_50;
  double local_48;
  
  cVar2 = input[offset];
  pcVar1 = input + offset;
  pauVar14 = (undefined1 (*) [16])(pcVar1 + (cVar2 == '-'));
  local_50 = input;
  if (pcVar1[cVar2 == '-'] == '0') {
    uVar9 = (uint)(byte)(*pauVar14)[1];
    if ((byte)((*pauVar14)[1] - 0x30) < 10) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"numbers cannot have leading zeros","");
      __error(&local_70,local_50,offset);
    }
    pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
    lVar15 = 0;
  }
  else {
    if ((byte)(pcVar1[cVar2 == '-'] - 0x3aU) < 0xf6) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"numbers must have integer parts","");
      __error(&local_70,local_50,offset);
    }
    uVar7 = *(ulong *)*pauVar14;
    lVar15 = 0;
    lVar19 = psubusb(CONCAT17((char)(uVar7 >> 0x38) + -0x30,
                              CONCAT16((char)(uVar7 >> 0x30) + -0x30,
                                       CONCAT15((char)(uVar7 >> 0x28) + -0x30,
                                                CONCAT14((char)(uVar7 >> 0x20) + -0x30,
                                                         CONCAT13((char)(uVar7 >> 0x18) + -0x30,
                                                                  CONCAT12((char)(uVar7 >> 0x10) +
                                                                           -0x30,CONCAT11((char)(
                                                  uVar7 >> 8) + -0x30,(char)uVar7 + -0x30))))))),
                     0x909090909090909);
    if (lVar19 == 0) {
      auVar18[8] = 0xd0;
      auVar18._0_8_ = 0xd0d0d0d0d0d0d0d0;
      auVar18[9] = 0xd0;
      auVar18[10] = 0xd0;
      auVar18[0xb] = 0xd0;
      auVar18[0xc] = 0xd0;
      auVar18[0xd] = 0xd0;
      auVar18[0xe] = 0xd0;
      auVar18[0xf] = 0xd0;
      auVar17._8_2_ = 0x10a;
      auVar17._0_8_ = 0x10a010a010a010a;
      auVar17._10_2_ = 0x10a;
      auVar17._12_2_ = 0x10a;
      auVar17._14_2_ = 0x10a;
      auVar24._8_4_ = 0x10064;
      auVar24._0_8_ = 0x1006400010064;
      auVar24._12_4_ = 0x10064;
      do {
        auVar21 = *pauVar14;
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
        auVar25 = vpaddb_avx(auVar21,auVar18);
        auVar25 = vpmaddubsw_avx(auVar25,auVar17);
        auVar25 = vpmaddwd_avx(auVar25,auVar24);
        auVar25 = vpackusdw_avx(auVar25,auVar25);
        auVar25 = vpmaddwd_avx(auVar25,SUB6416(ZEXT464(0x12710),0));
        lVar15 = CONCAT44((int)((ulong)lVar15 >> 0x20),auVar25._0_4_) + lVar15 * 100000000;
        uVar7 = vpextrq_avx(auVar21,1);
        lVar19 = psubusb(CONCAT17((char)(uVar7 >> 0x38) + -0x30,
                                  CONCAT16((char)(uVar7 >> 0x30) + -0x30,
                                           CONCAT15((char)(uVar7 >> 0x28) + -0x30,
                                                    CONCAT14((char)(uVar7 >> 0x20) + -0x30,
                                                             CONCAT13((char)(uVar7 >> 0x18) + -0x30,
                                                                      CONCAT12((char)(uVar7 >> 0x10)
                                                                               + -0x30,(short)
                                                  CONCAT71((int7)(uVar7 >> 8),(char)uVar7 + -0x30)))
                                                  )))),0x909090909090909);
      } while (lVar19 == 0);
    }
    uVar9 = (uint)uVar7;
    bVar10 = (byte)uVar7;
    while ((byte)(bVar10 - 0x30) < 10) {
      lVar15 = (ulong)(byte)((char)uVar7 - 0x30) + lVar15 * 10;
      bVar10 = (*pauVar14)[1];
      uVar7 = (ulong)bVar10;
      uVar9 = (uint)bVar10;
      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
    }
  }
  if ((ulong)((long)pauVar14 - (long)pcVar1) < 0x13) {
    if ((char)uVar9 == '.') {
      uVar7 = *(ulong *)(*pauVar14 + 1);
      auVar22 = ZEXT1664(CONCAT88(in_XMM6_Qa,(double)lVar15));
      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
      lVar19 = psubusb(CONCAT17((char)(uVar7 >> 0x38) + -0x30,
                                CONCAT16((char)(uVar7 >> 0x30) + -0x30,
                                         CONCAT15((char)(uVar7 >> 0x28) + -0x30,
                                                  CONCAT14((char)(uVar7 >> 0x20) + -0x30,
                                                           CONCAT13((char)(uVar7 >> 0x18) + -0x30,
                                                                    CONCAT12((char)(uVar7 >> 0x10) +
                                                                             -0x30,CONCAT11((char)(
                                                  uVar7 >> 8) + -0x30,(char)uVar7 + -0x30))))))),
                       0x909090909090909);
      if (lVar19 == 0) {
        auVar23 = ZEXT1664(ZEXT816(0x3fb999999999999a));
        auVar25[8] = 0xd0;
        auVar25._0_8_ = 0xd0d0d0d0d0d0d0d0;
        auVar25[9] = 0xd0;
        auVar25[10] = 0xd0;
        auVar25[0xb] = 0xd0;
        auVar25[0xc] = 0xd0;
        auVar25[0xd] = 0xd0;
        auVar25[0xe] = 0xd0;
        auVar25[0xf] = 0xd0;
        auVar27._8_2_ = 0x10a;
        auVar27._0_8_ = 0x10a010a010a010a;
        auVar27._10_2_ = 0x10a;
        auVar27._12_2_ = 0x10a;
        auVar27._14_2_ = 0x10a;
        auVar29._8_4_ = 0x10064;
        auVar29._0_8_ = 0x1006400010064;
        auVar29._12_4_ = 0x10064;
        do {
          auVar18 = *pauVar14;
          pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
          auVar17 = vpaddb_avx(auVar18,auVar25);
          uVar7 = vpextrq_avx(auVar18,1);
          auVar18 = vpmaddubsw_avx(auVar17,auVar27);
          lVar19 = psubusb(CONCAT17((char)(uVar7 >> 0x38) + -0x30,
                                    CONCAT16((char)(uVar7 >> 0x30) + -0x30,
                                             CONCAT15((char)(uVar7 >> 0x28) + -0x30,
                                                      CONCAT14((char)(uVar7 >> 0x20) + -0x30,
                                                               CONCAT13((char)(uVar7 >> 0x18) +
                                                                        -0x30,CONCAT12((char)(uVar7 
                                                  >> 0x10) + -0x30,
                                                  (short)CONCAT71((int7)(uVar7 >> 8),
                                                                  (char)uVar7 + -0x30))))))),
                           0x909090909090909);
          auVar18 = vpmaddwd_avx(auVar18,auVar29);
          auVar18 = vpackusdw_avx(auVar18,auVar18);
          auVar18 = vpmaddwd_avx(auVar18,SUB6416(ZEXT464(0x12710),0));
          auVar18 = vcvtudq2pd_avx512vl(auVar18);
          dVar20 = auVar23._0_8_;
          auVar23 = ZEXT864((ulong)(dVar20 * 1e-08));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = auVar18._0_8_ * dVar20;
          auVar18 = vfmadd231sd_fma(auVar22._0_16_,auVar30,ZEXT816(0x3e7ad7f29abcaf48));
          auVar22 = ZEXT1664(auVar18);
        } while (lVar19 == 0);
      }
      else {
        auVar23 = ZEXT1664(ZEXT816(0x3fb999999999999a));
      }
      auVar21 = auVar22._0_16_;
      dVar20 = auVar23._0_8_;
      uVar9 = (uint)uVar7;
      bVar10 = (byte)uVar7;
      while ((byte)(bVar10 - 0x30) < 10) {
        auVar28._0_8_ = (double)(int)(char)((char)uVar7 + -0x30);
        auVar28._8_8_ = in_XMM10_Qb;
        bVar10 = (*pauVar14)[1];
        uVar9 = (uint)bVar10;
        uVar7 = (ulong)uVar9;
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
        auVar21 = vfmadd231sd_fma(auVar22._0_16_,auVar23._0_16_,auVar28);
        auVar22 = ZEXT1664(auVar21);
        dVar20 = auVar23._0_8_ * 0.1;
        auVar23 = ZEXT864((ulong)dVar20);
      }
      bVar12 = true;
      if ((dVar20 == 0.1) && (!NAN(dVar20))) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"excessive characters at end of number","");
        __error(&local_70,local_50,(size_t)(*pauVar14 + ~(ulong)local_50));
      }
    }
    else {
      auVar21 = (undefined1  [16])0x0;
      bVar12 = false;
    }
    cVar6 = (char)uVar9;
    if ((uVar9 & 0xff | 0x20) == 0x65) {
      bVar11 = true;
      if (bVar12 != false) {
        bVar11 = bVar12;
      }
      cVar6 = (*pauVar14)[1];
      bVar16 = (cVar6 - 0x2bU & 0xfd) == 0;
      pauVar13 = (undefined1 (*) [16])(*pauVar14 + 1);
      if (bVar16) {
        pauVar13 = (undefined1 (*) [16])(*pauVar14 + 2);
      }
      bVar10 = (*pauVar14)[(ulong)bVar16 + 1];
      if ((byte)(bVar10 - 0x3a) < 0xf6) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"numbers must not have null exponents","");
        __error(&local_70,local_50,(long)pauVar13 - (long)local_50);
      }
      local_48 = (double)((ulong)bVar12 * auVar21._0_8_ + (ulong)!bVar12 * (long)(double)lVar15);
      auVar18 = ZEXT816(0) << 0x40;
      do {
        uVar9 = (uint)bVar10;
        bVar10 = (*pauVar13)[1];
        pauVar13 = (undefined1 (*) [16])(*pauVar13 + 1);
        auVar26._0_8_ = (double)(int)(uVar9 - 0x30);
        auVar26._8_8_ = in_XMM10_Qb;
        auVar18 = vfmadd132sd_fma(auVar18,auVar26,ZEXT816(0x4024000000000000));
      } while ((byte)(bVar10 - 0x30) < 10);
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar17 = vandpd_avx512vl(auVar18,auVar3);
      if (308.0 < auVar17._0_8_) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"decimal exponent out of range","");
        __error(&local_70,local_50,offset);
      }
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(auVar18,auVar4);
      dVar20 = pow(10.0,(double)((ulong)(cVar6 == '-') * auVar17._0_8_ +
                                (ulong)(cVar6 != '-') * auVar18._0_8_));
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar20 * local_48;
      cVar6 = (*pauVar13)[0];
      pauVar14 = pauVar13;
      bVar12 = bVar11;
    }
    dVar20 = auVar21._0_8_;
    if (*(long *)(kStructuralOrWhitespace + (long)cVar6 * 8) == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"excessive characters at end of number","");
      __error(&local_70,local_50,(long)pauVar14 - (long)local_50);
    }
    *is_decimal = bVar12;
    if (cVar2 == '-') {
      if (bVar12 == false) {
        return -lVar15;
      }
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar18 = vxorpd_avx512vl(auVar21,auVar5);
      dVar20 = auVar18._0_8_;
    }
    else if (bVar12 == false) {
      return lVar15;
    }
    lVar8 = plain_convert(dVar20);
    return lVar8;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"integer part too large","");
  __error(&local_70,local_50,offset);
}

Assistant:

long long int parse_number(const char *input, bool *is_decimal, size_t offset) {
#if NO_PARSE_NUMBER
        *is_decimal = false;
        return 0LL;
#endif
        const char *s = input + offset;
        long long int integer = 0LL;
        double decimal = 0.0;
        bool negative = false, _is_decimal = false;
        if (*s == '-') {
            ++s;
            negative = true;
        }
        if (*s == '0') {
            ++s;
            if (*s >= '0' && *s <= '9')
                __error("numbers cannot have leading zeros", input, offset);
        } else {
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must have integer parts", input, offset);
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                integer = integer * 100000000 + _parse_eight_digits(s);
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9')
                integer = integer * 10 + (*s++ - '0');
        }
        if (s - input - offset > 18)
            __error("integer part too large", input, offset);
        if (*s == '.') {
            _is_decimal = true;
            decimal = integer;
            double multiplier = 0.1;
            ++s;
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                decimal += _parse_eight_digits(s) * multiplier * 0.0000001;  // 7 digits
                multiplier *= 0.00000001;  // 8 digits
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9') {
                decimal += (*s++ - '0') * multiplier;
                multiplier *= 0.1;
            }if (multiplier == 0.1)
                __error("excessive characters at end of number", input, s - input - 1);
        }
        if (*s == 'e' || *s == 'E') {
            if (!_is_decimal) {
                _is_decimal = true;
                decimal = integer;
            }
            ++s;
            bool negative_exp = false;
            if (*s == '-') {
                negative_exp = true;
                ++s;
            } else if (*s == '+') ++s;
            double exponent = 0.0;
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must not have null exponents", input, s - input);
            do {
                exponent = exponent * 10.0 + (*s++ - '0');
            } while (*s >= '0' && *s <= '9');
            if (negative_exp) exponent = -exponent;
            if (exponent < -308 || exponent > 308)
                __error("decimal exponent out of range", input, offset);
            decimal *= pow(10.0, exponent);
        }
        if (!kStructuralOrWhitespace[*s])
            __error("excessive characters at end of number", input, s - input);
        *is_decimal = _is_decimal;
        if (negative) {
            if (_is_decimal) return plain_convert(-decimal);
            else return -integer;
        } else {
            if (_is_decimal) return plain_convert(decimal);
            else return integer;
        }
    }